

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.cc
# Opt level: O3

ostream * operator<<(ostream *outputStream,Array *arr)

{
  element_type *peVar1;
  long lVar2;
  ostream *poVar3;
  ulong uVar4;
  
  if (0 < arr->theSize) {
    uVar4 = 0;
    do {
      peVar1 = (arr->theArray).
               super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      lVar2 = (long)(peVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
      if ((ulong)((long)(peVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish - lVar2 >> 2) <= uVar4) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar4
                  );
      }
      poVar3 = (ostream *)
               std::ostream::operator<<((ostream *)outputStream,*(int *)(lVar2 + uVar4 * 4));
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      uVar4 = uVar4 + 1;
    } while ((long)uVar4 < (long)arr->theSize);
  }
  return outputStream;
}

Assistant:

ostream &operator<<(ostream &outputStream, Array &arr) {
    for (int i = 0; i < arr.theSize; i++)
        outputStream << arr[i] << " ";
    return outputStream;
}